

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

ReduceLogSumLayerParams * __thiscall
CoreML::Specification::ReduceLogSumLayerParams::New(ReduceLogSumLayerParams *this,Arena *arena)

{
  ReduceLogSumLayerParams *this_00;
  
  this_00 = (ReduceLogSumLayerParams *)operator_new(0x30);
  ReduceLogSumLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ReduceLogSumLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

ReduceLogSumLayerParams* ReduceLogSumLayerParams::New(::google::protobuf::Arena* arena) const {
  ReduceLogSumLayerParams* n = new ReduceLogSumLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}